

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_group_t bsc_group_create_neighbourhood(bsc_pid_t *neighbours,bsc_size_t size)

{
  int iVar1;
  bsp_pid_t *pbVar2;
  bsp_pid_t *pbVar3;
  bsp_size_t *pbVar4;
  uint uVar5;
  bsp_pid_t bVar6;
  undefined4 extraout_var;
  void *addr;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  group_t *pgVar10;
  ulong uVar11;
  int members;
  ulong uVar12;
  bsc_size_t offset;
  undefined4 local_54;
  group_t *local_50;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  uVar5 = bsp_nprocs();
  bVar6 = bsp_pid();
  addr = calloc((long)(int)uVar5,4);
  pvVar7 = calloc((long)(int)uVar5,4);
  local_50 = (group_t *)calloc(1,0x20);
  local_40 = pvVar7;
  if ((pvVar7 == (void *)0x0 || addr == (void *)0x0) || local_50 == (group_t *)0x0) {
    bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
  }
  local_48 = (ulong)uVar5;
  bsp_push_reg(addr,uVar5 * 4);
  bsp_sync();
  if (0 < size) {
    uVar9 = 0;
    do {
      uVar12 = uVar9 + 1;
      local_54 = (int)uVar12;
      bsp_put(neighbours[uVar9],&local_54,addr,bVar6 * 4,4);
      *(int *)((long)local_40 + (long)neighbours[uVar9] * 4) = (int)uVar12;
      uVar9 = uVar12;
    } while ((uint)size != uVar12);
  }
  local_38 = (ulong)(uint)size;
  bsp_sync();
  pvVar7 = local_40;
  if (*(int *)((long)local_40 + (long)bVar6 * 4) == 0) {
    bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");
  }
  pgVar10 = local_50;
  if ((int)local_48 < 1) {
    group_create(local_50,0);
  }
  else {
    uVar12 = local_48 & 0xffffffff;
    uVar9 = 0;
    members = 0;
    do {
      iVar1 = *(int *)((long)pvVar7 + uVar9 * 4);
      if (*(int *)((long)addr + uVar9 * 4) == 0) {
        if (iVar1 != 0) {
          uVar8 = uVar9 & 0xffffffff;
          uVar11 = CONCAT44(extraout_var,bVar6);
          goto LAB_00112866;
        }
      }
      else if (iVar1 == 0) {
        uVar8 = CONCAT44(extraout_var,bVar6);
        uVar11 = uVar9 & 0xffffffff;
LAB_00112866:
        bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d is a neighbour, but that feeling is not mutual\n"
                  ,uVar11,uVar8);
      }
      else {
        members = members + 1;
      }
      pgVar10 = local_50;
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
    group_create(local_50,members);
    if (0 < (int)local_48) {
      memset(pgVar10->lid,0xff,uVar12 << 2);
    }
  }
  if (0 < size) {
    pbVar2 = pgVar10->lid;
    pbVar3 = pgVar10->gid;
    pbVar4 = pgVar10->rof;
    uVar9 = 0;
    do {
      pbVar2[neighbours[uVar9]] = (bsp_pid_t)uVar9;
      pbVar4[uVar9] = *(int *)((long)addr + (long)neighbours[uVar9] * 4) + -1;
      pbVar3[uVar9] = neighbours[uVar9];
      uVar9 = uVar9 + 1;
    } while (local_38 != uVar9);
  }
  bsp_pop_reg(addr);
  bsp_sync();
  free(addr);
  free(pvVar7);
  return pgVar10;
}

Assistant:

bsc_group_t bsc_group_create_neighbourhood( bsc_pid_t * neighbours, 
        bsc_size_t size )
{
    bsc_pid_t i, P = bsp_nprocs(), s = bsp_pid();
    bsc_pid_t n_members = 0;
    bsc_size_t * incoming = calloc( P, sizeof(incoming[0]));
    bsc_size_t * outgoing = calloc( P, sizeof(outgoing[0]));
    group_t * g = calloc( 1, sizeof(*g) );
    if (!incoming || !outgoing || !g)
        bsp_abort("bsc_group_create_neighbourhood: Insufficient memory");
    bsp_push_reg( incoming, P*sizeof(incoming[0]) );
    bsp_sync();

    /* fill the communication matrix with a 1 for each connection */
    for ( i = 0 ; i < size ; ++i ) {
        bsc_size_t offset = i+1;
        bsp_put( neighbours[i], &offset, incoming, s*sizeof(offset), sizeof(offset) );
        outgoing[ neighbours[i] ] = i+1 ;
    }
    bsp_sync();

    if ( !outgoing[s] )
        bsp_abort("bsc_group_create_neighbourhood: Group must include calling process");

    /* take the intersection of incoming and outgoing */
    for ( i = 0; i < P; ++i ) {
        if (incoming[i] && !outgoing[i])  {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    i, s );
        }
        else if (!incoming[i] && outgoing[i]) {
            bsp_abort("bsc_group_create_neighourhood: Processes %d thinks %d"
                    " is a neighbour, but that feeling is not mutual\n",
                    s, i );
        }
        else if (incoming[i] && outgoing[i])
            n_members += 1;
    }

    group_create( g, n_members );
    for ( i = 0; i < P; ++i )
        g->lid[i] = -1;

    for ( i = 0; i < size; ++i ) {
        g->lid[ neighbours[i] ] = i;
        g->rof[ i ] = incoming[ neighbours[i] ] - 1;
        g->gid[ i ] = neighbours[i];
    }

    bsp_pop_reg(incoming);
    bsp_sync();
    free(incoming);
    free(outgoing);

    return g;
}